

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::IsDefinitionSet(cmMakefile *this,string *name)

{
  cmake *pcVar1;
  cmVariableWatch *this_00;
  char *pcVar2;
  bool bVar3;
  
  pcVar2 = cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
  bVar3 = true;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = cmState::GetInitializedCacheValue(this->GlobalGenerator->CMakeInstance->State,name);
    bVar3 = pcVar2 != (char *)0x0;
  }
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  if ((pcVar1 != (cmake *)0x0) &&
     (this_00 = pcVar1->VariableWatch, this_00 != (cmVariableWatch *)0x0 && bVar3 == false)) {
    cmVariableWatch::VariableAccessed(this_00,name,2,(char *)0x0,this);
  }
  return bVar3;
}

Assistant:

bool cmMakefile::IsDefinitionSet(const std::string& name) const
{
  const char* def = this->StateSnapshot.GetDefinition(name);
  if (!def) {
    def = this->GetState()->GetInitializedCacheValue(name);
  }
#ifdef CMAKE_BUILD_WITH_CMAKE
  if (cmVariableWatch* vv = this->GetVariableWatch()) {
    if (!def) {
      vv->VariableAccessed(
        name, cmVariableWatch::UNKNOWN_VARIABLE_DEFINED_ACCESS, def, this);
    }
  }
#endif
  return def != CM_NULLPTR;
}